

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *context;
  bool bVar3;
  char *pcVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  GLenum GVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar10;
  Vec4 *pVVar11;
  ostream *poVar12;
  int i;
  Surface *pSVar13;
  long lVar14;
  void *__buf;
  void *__buf_00;
  bool bVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  bool bVar20;
  int iVar21;
  float fVar22;
  Surface renderedImg;
  Vector<float,_4> res_1;
  Vec4 inputClr;
  Surface errorMask;
  Random rnd;
  Vector<float,_4> res;
  int local_318;
  Surface local_300;
  string local_2e8;
  string local_2c8;
  int local_2a8;
  int local_2a4;
  Surface local_2a0;
  long local_288;
  char *local_280;
  Vec4 local_278;
  deRandom local_268;
  undefined1 local_258 [32];
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [4];
  ios_base local_1e0 [272];
  Quad local_d0;
  
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_268,dVar6);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)CONCAT44(extraout_var,iVar7);
  if (0xff < iVar7) {
    iVar7 = 0x100;
  }
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)(CONCAT44(extraout_var_00,iVar8) + 4);
  iVar21 = 0x100;
  if (iVar8 < 0x100) {
    iVar21 = iVar8;
  }
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)CONCAT44(extraout_var_01,iVar8);
  dVar6 = deRandom_getUint32(&local_268);
  uVar16 = dVar6 % ((iVar8 - iVar7) + 1U);
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)(CONCAT44(extraout_var_02,iVar8) + 4);
  dVar6 = deRandom_getUint32(&local_268);
  uVar18 = dVar6 % ((iVar8 - iVar21) + 1U);
  local_278.m_data[0] = 0.0;
  local_278.m_data[1] = 0.0;
  local_278.m_data[2] = 0.0;
  local_278.m_data[3] = 0.0;
  local_d0.posA.m_data[0] = -1.0;
  local_d0.posA.m_data[1] = -1.0;
  local_d0.posB.m_data = (float  [2])&DAT_3f8000003f800000;
  memset(local_d0.color,0,0x90);
  tcu::Surface::Surface(&local_300,iVar7,iVar21);
  glwViewport(uVar16,uVar18,iVar7,iVar21);
  GVar9 = glwGetError();
  glu::checkError(GVar9,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0xfe);
  poVar1 = (ostringstream *)(local_258 + 8);
  local_258._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Dithering is ",0xd);
  pcVar19 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((ulong)this->m_ditheringEnabled != 0) {
    pcVar19 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar19 + 0x27,8 - (ulong)this->m_ditheringEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1e0);
  if (this->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar6 = glwGetError();
    iVar8 = 0x103;
    pcVar19 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar6 = glwGetError();
    iVar8 = 0x105;
    pcVar19 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar6,pcVar19,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,iVar8);
  poVar1 = (ostringstream *)(local_258 + 8);
  local_258._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Drawing a ",10);
  pcVar19 = "horizontally";
  if (isVerticallyIncreasing) {
    pcVar19 = "vertically";
  }
  uVar10 = (ulong)!isVerticallyIncreasing;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar19,uVar10 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," increasing gradient",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1e0);
  local_d0.color[0].m_data[0] = 0.0;
  local_d0.color[0].m_data[1] = 0.0;
  local_d0.color[0].m_data[2] = 0.0;
  local_d0.color[0].m_data[3] = 0.0;
  pVVar11 = &local_278;
  if (isVerticallyIncreasing) {
    pVVar11 = highColor;
  }
  local_d0.color[1].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
  local_d0.color[1].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
  pVVar11 = &local_278;
  if (!isVerticallyIncreasing) {
    pVVar11 = highColor;
  }
  local_d0.color[2].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
  local_d0.color[2].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
  local_d0.color[3].m_data._0_8_ = *(undefined8 *)highColor->m_data;
  local_d0.color[3].m_data._8_8_ = *(undefined8 *)(highColor->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&local_d0);
  context = this->m_renderCtx;
  local_2c8._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
    local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_258,(TextureFormat *)&local_2c8,local_300.m_width,
             local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
  glu::readPixels(context,uVar16,uVar18,(PixelBufferAccess *)local_258);
  GVar9 = glwGetError();
  glu::checkError(GVar9,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0x111);
  pcVar19 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar19 = "VerGradient";
  }
  pcVar4 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar4 = "VerGradient";
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,pcVar19,pcVar4 + 0xb);
  pcVar19 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar19 = "Vertical gradient";
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,pcVar19,pcVar19 + uVar10 * 2 + 0x11);
  pSVar13 = &local_300;
  tcu::LogImage::LogImage
            ((LogImage *)local_258,&local_2c8,&local_2e8,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_258,TVar2.order,__buf,(size_t)pSVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != local_228) {
    operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
  }
  if (local_258._0_8_ != (long)local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface(&local_2a0,iVar7,iVar21);
  if (0 < local_300.m_height) {
    poVar1 = (ostringstream *)(local_258 + 8);
    iVar7 = 0;
    bVar15 = true;
    do {
      if (0 < local_300.m_width) {
        iVar8 = 0;
        do {
          iVar21 = iVar8;
          if (isVerticallyIncreasing) {
            iVar21 = iVar7;
          }
          iVar17 = local_300.m_height;
          if (!isVerticallyIncreasing) {
            iVar17 = local_300.m_width;
          }
          fVar22 = ((float)iVar21 + 0.5) / (float)iVar17;
          local_258._0_4_ = R;
          local_258._4_4_ = SNORM_INT8;
          local_258._8_8_ = 0;
          lVar14 = 0;
          do {
            *(float *)(local_258 + lVar14 * 4) = local_278.m_data[lVar14] * (1.0 - fVar22);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          local_2e8._M_dataplus._M_p = (pointer)0x0;
          local_2e8._M_string_length = 0;
          lVar14 = 0;
          do {
            *(float *)((long)&local_2e8._M_dataplus._M_p + lVar14 * 4) =
                 highColor->m_data[lVar14] * fVar22;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          local_2c8._M_dataplus._M_p = (pointer)0x0;
          local_2c8._M_string_length = 0;
          lVar14 = 0;
          do {
            *(float *)((long)&local_2c8._M_dataplus._M_p + lVar14 * 4) =
                 *(float *)(local_258 + lVar14 * 4) +
                 *(float *)((long)&local_2e8._M_dataplus._M_p + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          local_258._0_4_ =
               *(ChannelOrder *)
                ((long)local_300.m_pixels.m_ptr + (long)(local_300.m_width * iVar7 + iVar8) * 4);
          bVar5 = checkColor(this,(Vec4 *)&local_2c8,(RGBA *)local_258,bVar15);
          lVar14 = (long)(local_2a0.m_width * iVar7 + iVar8);
          if (bVar5) {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar14 * 4) = 0xff00ff00;
          }
          else {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar14 * 4) = 0xff0000ff;
            if (bVar15 != false) {
              local_258._0_8_ = TVar2;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"First failure at pixel (",0x18);
              std::ostream::operator<<(poVar1,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") (not printing further errors)",0x1f);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_1e0);
              bVar15 = false;
            }
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < local_300.m_width);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_300.m_height);
    if (bVar15 == false) {
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,"ColorChoiceErrorMask","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Error mask for color choices","");
      pSVar13 = &local_2a0;
      tcu::LogImage::LogImage
                ((LogImage *)local_258,&local_2c8,&local_2e8,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_258,TVar2.order,__buf_00,(size_t)pSVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != local_228) {
        operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
      }
      if (local_258._0_8_ != (long)local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      tcu::Surface::~Surface(&local_2a0);
      bVar15 = false;
      goto LAB_003983d7;
    }
  }
  tcu::Surface::~Surface(&local_2a0);
  bVar15 = true;
  if (this->m_ditheringEnabled == false) {
    local_2a4 = local_300.m_height;
    local_2a8 = local_300.m_width;
    if (isVerticallyIncreasing) {
      local_2a4 = local_300.m_width;
      local_2a8 = local_300.m_height;
    }
    if (0 < local_2a8) {
      bVar15 = 0 < local_2a4;
      local_280 = "column";
      if (isVerticallyIncreasing) {
        local_280 = "row";
      }
      poVar1 = (ostringstream *)(local_258 + 8);
      local_288 = uVar10 * 3 + 3;
      local_318 = 0;
      bVar5 = false;
      iVar7 = local_2a4;
      do {
        bVar20 = bVar15;
        if (0 < iVar7) {
          iVar8 = 0;
          uVar16 = 0;
          do {
            iVar17 = iVar8;
            iVar21 = local_318;
            if (isVerticallyIncreasing) {
              iVar17 = local_318;
              iVar21 = iVar8;
            }
            uVar18 = *(uint *)((long)local_300.m_pixels.m_ptr +
                              (long)(local_300.m_width * iVar17 + iVar21) * 4);
            bVar3 = true;
            if ((iVar8 != 0) && (uVar18 != uVar16)) {
              bVar3 = true;
              if (bVar5) {
                local_258._0_8_ = TVar2;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"Failure: colors should be constant per ",0x27);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,local_280,local_288);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,
                           " (since dithering is disabled), but the color at position (",0x3b);
                std::ostream::operator<<(poVar1,iVar21);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::operator<<(poVar1,iVar17);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") is ",5);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
                poVar12 = (ostream *)std::ostream::operator<<(poVar1,uVar18 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18 >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18 >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," and does not equal the color at (",0x22);
                iVar7 = local_318;
                if (isVerticallyIncreasing) {
                  iVar7 = iVar8 + -1;
                }
                std::ostream::operator<<(poVar1,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                iVar7 = iVar8 + -1;
                if (isVerticallyIncreasing) {
                  iVar7 = local_318;
                }
                std::ostream::operator<<(poVar1,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"), which is ",0xc);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
                poVar12 = (ostream *)std::ostream::operator<<(poVar1,uVar16 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar16 >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar16 >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar16 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_1e0);
                bVar3 = false;
                iVar7 = local_2a4;
                uVar18 = uVar16;
              }
              else {
                bVar5 = true;
              }
            }
            uVar16 = uVar18;
            if (!bVar3) {
              iVar8 = 1;
              goto LAB_003982aa;
            }
            iVar8 = iVar8 + 1;
            bVar20 = iVar8 < iVar7;
          } while (iVar8 != iVar7);
        }
        iVar8 = 0;
LAB_003982aa:
        if (bVar20) goto LAB_003982cc;
        local_318 = local_318 + 1;
      } while (local_318 != local_2a8);
    }
    iVar8 = 0xe;
LAB_003982cc:
    bVar15 = iVar8 == 0 || iVar8 == 0xe;
  }
LAB_003983d7:
  tcu::Surface::~Surface(&local_300);
  return bVar15;
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					// Allow color to change once to take into account possibly
					// discontinuity between triangles
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}